

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vrle.cpp
# Opt level: O0

VRle operator-(VRect *rect,VRle *o)

{
  bool bVar1;
  size_t in_RCX;
  vcow_ptr<VRle::Data> *in_RDX;
  void *__buf;
  void *__buf_00;
  int __fd;
  VRect *in_RSI;
  model *in_RDI;
  VRle *result;
  Data *in_stack_00000870;
  Data *in_stack_00000878;
  Data *in_stack_00000880;
  vcow_ptr<VRle::Data> rect_00;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  
  rect_00.mModel = in_RDI;
  bVar1 = VRect::empty(in_RSI);
  if (bVar1) {
    memset(in_RDI,0,8);
    VRle::VRle((VRle *)0x123aab);
  }
  else {
    _ZTWL14Scratch_Object();
    VRle::Data::reset((Data *)in_RDI);
    _ZTWL14Scratch_Object();
    __fd = (int)in_RSI;
    VRle::Data::addRect((Data *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),
                        (VRect *)rect_00.mModel);
    VRle::VRle((VRle *)0x123adb);
    vcow_ptr<VRle::Data>::write((vcow_ptr<VRle::Data> *)in_RDI,__fd,__buf,in_RCX);
    _ZTWL14Scratch_Object();
    vcow_ptr<VRle::Data>::read(in_RDX,__fd,__buf_00,in_RCX);
    VRle::Data::opSubstract(in_stack_00000880,in_stack_00000878,in_stack_00000870);
  }
  return (VRle)(vcow_ptr<VRle::Data>)rect_00.mModel;
}

Assistant:

VRle operator-(const VRect &rect, const VRle &o)
{
    if (rect.empty()) return {};

    Scratch_Object.reset();
    Scratch_Object.addRect(rect);

    VRle result;
    result.d.write().opSubstract(Scratch_Object, o.d.read());

    return result;
}